

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  ulong uVar1;
  double dVar2;
  double __y;
  double theta_00;
  double dVar3;
  double objective_amplifier;
  random_engine *rng_;
  result_type_conflict2 rVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  rep rVar8;
  pointer P;
  pointer pi;
  reference sol;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_458;
  uint local_430;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i_1;
  string_view local_408;
  undefined1 local_3f8 [8];
  pnm_observer obs;
  double kappa;
  int iStack_194;
  bool start_push;
  int e;
  int i;
  bit_array empty_x;
  bernoulli_distribution choose_mutation;
  compute_order compute;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
  slv;
  long w_limit;
  double pushing_objective_amplifier;
  double pushing_k_factor;
  double delta;
  double theta;
  double alpha;
  double kappa_max;
  double kappa_step;
  default_cost_type<double> norm_costs;
  solver_parameters *p;
  int best_remaining;
  undefined1 local_50 [8];
  bit_array x;
  double cost_constant_local;
  default_cost_type<double> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
  *this_local;
  result *r;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 0;
  baryonyx::result::result(__return_storage_ptr__);
  bit_array::bit_array((bit_array *)local_50,variables);
  p._0_4_ = 0x7fffffff;
  norm_costs.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&kappa_step,this->m_ctx,original_costs,this->m_rng,variables);
  uVar1 = *(ulong *)((long)norm_costs.linear_elements._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20);
  dVar2 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28);
  __y = *(double *)
         ((long)norm_costs.linear_elements._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30);
  theta_00 = *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10)) {
    local_458 = *(double *)
                 ((long)norm_costs.linear_elements._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10);
  }
  else {
    local_458 = compute_delta<double,baryonyx::itm::default_cost_type<double>>
                          (this->m_ctx,(default_cost_type<double> *)&kappa_step,theta_00,variables);
  }
  dVar3 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38);
  objective_amplifier =
       *(double *)
        ((long)norm_costs.linear_elements._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40);
  slv._128_8_ = (BADTYPE)*(double *)
                          ((long)norm_costs.linear_elements._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0);
  rng_ = this->m_rng;
  iVar7 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
  ::solver_random_inequalities_101coeff
            ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
              *)&compute.order,rng_,iVar7,variables,(cost_type *)&kappa_step,constraints);
  compute_order::compute_order
            ((compute_order *)&choose_mutation,
             *(constraint_order *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xcc),variables);
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,
             (this->m_ctx->parameters).init_policy_random);
  bit_array::bit_array((bit_array *)&e);
  iVar7 = *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xd4);
  if (iVar7 == 0) {
    init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_50,original_costs,variables,0);
  }
  else if (iVar7 == 1) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_50,(bit_array *)&e,this->m_rng,original_costs,constraints,1.0);
  }
  else if (iVar7 == 2) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&e,(bit_array *)local_50,this->m_rng,original_costs,constraints,1.0);
  }
  iStack_194 = 0;
  iVar7 = bit_array_impl::size((bit_array_impl *)local_50);
  for (; iStack_194 != iVar7; iStack_194 = iStack_194 + 1) {
    rVar4 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,this->m_rng);
    if (rVar4) {
      bit_array_impl::invert((bit_array_impl *)local_50,iStack_194);
    }
  }
  bit_array::~bit_array((bit_array *)&e);
  bVar6 = false;
  obs.m_ap_obs.m_basename.field_2._8_8_ =
       *(undefined8 *)
        ((long)norm_costs.linear_elements._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,"img");
  pnm_observer::pnm_observer
            ((pnm_observer *)local_3f8,local_408,slv.dist._M_param._M_p._0_4_,
             slv.dist._M_param._M_p._4_4_,
             *(long *)((long)norm_costs.linear_elements._M_t.
                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                             super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0));
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar8;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar8;
  compute_order::
  init<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
            ((compute_order *)&choose_mutation,
             (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
              *)&compute.order,(bit_array *)local_50);
  for (_push = 0;
      _push != *(long *)((long)norm_costs.linear_elements._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0);
      _push = _push + 1) {
    iVar7 = compute_order::
            run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array,double>
                      ((compute_order *)&choose_mutation,
                       (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                        *)&compute.order,(bit_array *)local_50,this->m_rng,
                       (double)obs.m_ap_obs.m_basename.field_2._8_8_,local_458,theta_00);
    P = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&slv.pi);
    pi = std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                   ((unique_ptr<double[],_std::default_delete<double[]>_> *)&slv.b);
    pnm_observer::make_observation<double>
              ((pnm_observer *)local_3f8,(sparse_matrix<int> *)&slv,P,pi);
    if (iVar7 == 0) {
      dVar9 = default_cost_type<double>::results(original_costs,(bit_array *)local_50,cost_constant)
      ;
      store_if_better(this,(bit_array *)local_50,dVar9,_push);
      bVar6 = true;
      break;
    }
    if (iVar7 < (int)p) {
      store_if_better(this,(bit_array *)local_50,iVar7,_push);
      p._0_4_ = iVar7;
    }
    if ((long)slv._128_8_ < _push) {
      auVar10._0_8_ = pow((double)iVar7 / (double)slv.dist._M_param._M_p._0_4_,__y);
      auVar10._8_56_ = extraout_var;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = obs.m_ap_obs.m_basename.field_2._8_8_;
      auVar12 = vfmadd213sd_fma(auVar10._0_16_,auVar12,auVar14);
      obs.m_ap_obs.m_basename.field_2._8_8_ = auVar12._0_8_;
    }
    if (dVar2 < (double)obs.m_ap_obs.m_basename.field_2._8_8_) {
      __return_storage_ptr__->status = kappa_max_reached;
      break;
    }
    bVar5 = is_timelimit_reached(this);
    if (bVar5) {
      __return_storage_ptr__->status = time_limit_reached;
      break;
    }
  }
  if (bVar6) {
    for (iter = 0;
        iter < *(int *)((long)norm_costs.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xbc);
        iter = iter + 1) {
      iVar7 = compute_order::
              push_and_run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array,double>
                        ((compute_order *)&choose_mutation,
                         (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                          *)&compute.order,(bit_array *)local_50,this->m_rng,
                         dVar3 * (double)obs.m_ap_obs.m_basename.field_2._8_8_,local_458,theta_00,
                         objective_amplifier);
      if (iVar7 == 0) {
        dVar9 = default_cost_type<double>::results
                          (original_costs,(bit_array *)local_50,cost_constant);
        store_if_better(this,(bit_array *)local_50,dVar9,
                        (long)(-iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                                  .super__Head_base<0UL,_double_*,_false>.
                                                  _M_head_impl + 0xc0) + -1));
      }
      bVar6 = is_timelimit_reached(this);
      if (bVar6) break;
      for (local_430 = 0;
          (int)local_430 <
          *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xc0);
          local_430 = local_430 + 1) {
        iVar7 = compute_order::
                run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array,double>
                          ((compute_order *)&choose_mutation,
                           (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                            *)&compute.order,(bit_array *)local_50,this->m_rng,
                           (double)obs.m_ap_obs.m_basename.field_2._8_8_,local_458,theta_00);
        if (iVar7 == 0) {
          dVar9 = default_cost_type<double>::results
                            (original_costs,(bit_array *)local_50,cost_constant);
          store_if_better(this,(bit_array *)local_50,dVar9,
                          (long)(int)(~local_430 +
                                     -iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                                  .super__Head_base<0UL,_double_*,_false>.
                                                  _M_head_impl + 0xc0)));
          break;
        }
        if (*(double *)
             ((long)norm_costs.linear_elements._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0) <
            (double)(int)local_430) {
          auVar11._0_8_ = pow((double)iVar7 / (double)slv.dist._M_param._M_p._0_4_,__y);
          auVar11._8_56_ = extraout_var_00;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar1;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = obs.m_ap_obs.m_basename.field_2._8_8_;
          auVar12 = vfmadd213sd_fma(auVar11._0_16_,auVar13,auVar15);
          obs.m_ap_obs.m_basename.field_2._8_8_ = auVar12._0_8_;
        }
        if ((dVar2 < (double)obs.m_ap_obs.m_basename.field_2._8_8_) ||
           (bVar6 = is_timelimit_reached(this), bVar6)) break;
      }
    }
  }
  else {
    __return_storage_ptr__->status = limit_reached;
  }
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  bVar6 = bit_array_impl::empty((bit_array_impl *)&this->m_best);
  if (!bVar6) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    sol = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                    (&__return_storage_ptr__->solutions,0);
    convert<baryonyx::itm::minimize_tag>(&this->m_best,sol,variables);
  }
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 1;
  pnm_observer::~pnm_observer((pnm_observer *)local_3f8);
  compute_order::~compute_order((compute_order *)&choose_mutation);
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
  ::~solver_random_inequalities_101coeff
            ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
              *)&compute.order);
  default_cost_type<double>::~default_cost_type((default_cost_type<double> *)&kappa_step);
  bit_array::~bit_array((bit_array *)local_50);
  if ((x.super_bit_array_impl.m_data._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    baryonyx::result::~result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }